

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc_wrapper.cpp
# Opt level: O2

size_t duckdb::Utf8Proc::PreviousGraphemeCluster(char *s,size_t len,size_t cpos)

{
  bool bVar1;
  ulong uVar2;
  ulong cpos_00;
  
  bVar1 = IsValid(s,len);
  if (bVar1) {
    uVar2 = 0;
    do {
      cpos_00 = uVar2;
      uVar2 = NextGraphemeCluster(s,len,cpos_00);
      if (uVar2 <= cpos_00) {
        return cpos_00;
      }
    } while (uVar2 < cpos);
  }
  else {
    cpos_00 = cpos - 1;
  }
  return cpos_00;
}

Assistant:

size_t Utf8Proc::PreviousGraphemeCluster(const char *s, size_t len, size_t cpos) {
	if (!Utf8Proc::IsValid(s, len)) {
		return cpos - 1;
	}
	size_t current_pos = 0;
	while (true) {
		size_t new_pos = NextGraphemeCluster(s, len, current_pos);
		if (new_pos <= current_pos || new_pos >= cpos) {
			return current_pos;
		}
		current_pos = new_pos;
	}
}